

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC3TL1SLTest
          (DatarateTestSVC *this)

{
  bool bVar1;
  uint uVar2;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var3;
  DatarateTestSVC *in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_array [2];
  I420VideoSource video;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe54;
  double *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  char *in_stack_fffffffffffffe68;
  int iVar6;
  Message *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  Type TVar7;
  HasNewFatalFailureHelper *in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe90;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffec8;
  AssertHelper *in_stack_fffffffffffffed0;
  AssertionResult local_118 [2];
  double local_f8;
  AssertionResult local_f0;
  int local_dc;
  uint local_c4;
  HasNewFatalFailureHelper local_c0;
  uint local_a8 [7];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x3f;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"hantro_collage_w352h288.yuv",&local_89);
  uVar5 = 300;
  uVar4 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (uint)((ulong)in_stack_fffffffffffffe70 >> 0x20),(uint)in_stack_fffffffffffffe70,
             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),(int)in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe90,(int)in_RDI);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_a8[0] = 200;
  local_a8[1] = 0x226;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::GetParam();
  p_Var3 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x7c7589);
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate = local_a8[*p_Var3];
  (*(in_RDI->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])();
  in_RDI->number_temporal_layers_ = 3;
  in_RDI->target_layer_bitrate_[0] =
       ((in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate * 0x32) / 100;
  in_RDI->target_layer_bitrate_[1] =
       ((in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate * 0x46) / 100;
  in_RDI->target_layer_bitrate_[2] =
       (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
  bVar1 = testing::internal::AlwaysTrue();
  TVar7 = (Type)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_fffffffffffffe80)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(in_RDI->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&in_RDI->super_DatarateTest,local_68);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_c0);
    if (bVar1) {
      local_c4 = 2;
    }
    else {
      local_c4 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffe54,uVar5));
    TVar7 = (Type)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    if (local_c4 == 0) {
      for (local_dc = 0; TVar7 = (Type)((ulong)in_stack_fffffffffffffe78 >> 0x20),
          local_dc < in_RDI->number_temporal_layers_ * in_RDI->number_spatial_layers_;
          local_dc = local_dc + 1) {
        local_f8 = (double)in_RDI->target_layer_bitrate_[local_dc] * 0.6;
        testing::internal::CmpHelperGE<double,double>
                  (in_stack_fffffffffffffe68,
                   (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe58,(double *)CONCAT44(in_stack_fffffffffffffe54,uVar5));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe80);
          in_stack_fffffffffffffe80 =
               (HasNewFatalFailureHelper *)
               testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffe54,uVar5),
                          (char (*) [61])CONCAT44(in_stack_fffffffffffffe4c,uVar4));
          in_stack_fffffffffffffe78 =
               (string *)testing::AssertionResult::failure_message((AssertionResult *)0x7c78e1);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe80,
                     (Type)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                     (char *)in_stack_fffffffffffffe70,
                     (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffed0,(Message *)in_stack_fffffffffffffec8._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,uVar5));
          testing::Message::~Message((Message *)0x7c793b);
        }
        local_c4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7c79c2);
        if (local_c4 != 0) goto LAB_007c7ccf;
        testing::internal::CmpHelperLE<double,double>
                  (in_stack_fffffffffffffe68,
                   (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe58,(double *)CONCAT44(in_stack_fffffffffffffe54,uVar5));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe80);
          in_stack_fffffffffffffe70 =
               testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffe54,uVar5),
                          (char (*) [63])CONCAT44(in_stack_fffffffffffffe4c,uVar4));
          in_stack_fffffffffffffe68 =
               testing::AssertionResult::failure_message((AssertionResult *)0x7c7a8c);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe80,
                     (Type)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                     (char *)in_stack_fffffffffffffe70,
                     (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffed0,(Message *)in_stack_fffffffffffffec8._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,uVar5));
          testing::Message::~Message((Message *)0x7c7ae6);
        }
        local_c4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7c7b6a);
        if (local_c4 != 0) goto LAB_007c7ccf;
      }
      uVar2 = GetMismatchFrames(in_RDI);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffe68,(char *)CONCAT44(uVar2,in_stack_fffffffffffffe60),
                 (int *)in_stack_fffffffffffffe58,(int *)CONCAT44(in_stack_fffffffffffffe54,uVar5));
      iVar6 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffec0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe80);
        testing::AssertionResult::failure_message((AssertionResult *)0x7c7c14);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe80,TVar7,(char *)in_stack_fffffffffffffe70
                   ,iVar6,(char *)CONCAT44(uVar2,in_stack_fffffffffffffe60));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffed0,(Message *)in_stack_fffffffffffffec8._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,uVar5));
        testing::Message::~Message((Message *)0x7c7c62);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x7c7cc4);
      local_c4 = 0;
      goto LAB_007c7ccf;
    }
    if (local_c4 != 2) goto LAB_007c7ccf;
  }
  iVar6 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffe80);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe80,TVar7,(char *)in_stack_fffffffffffffe70,iVar6
             ,(char *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffed0,(Message *)in_stack_fffffffffffffec8._M_head_impl);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,uVar5));
  testing::Message::~Message((Message *)0x7c77b5);
  local_c4 = 1;
LAB_007c7ccf:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x7c7cdc);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC3TL1SLTest() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 1;

    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, 300);
    const int bitrate_array[2] = { 200, 550 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    number_temporal_layers_ = 3;
    target_layer_bitrate_[0] = 50 * cfg_.rc_target_bitrate / 100;
    target_layer_bitrate_[1] = 70 * cfg_.rc_target_bitrate / 100;
    target_layer_bitrate_[2] = cfg_.rc_target_bitrate;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    for (int i = 0; i < number_temporal_layers_ * number_spatial_layers_; i++) {
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.60)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.60)
          << " The datarate for the file is greater than target by too much!";
    }
#if CONFIG_AV1_DECODER
    // Top temporal layers are non_reference, so exlcude them from
    // mismatch count, since loopfilter/cdef is not applied for these on
    // encoder side, but is always applied on decoder.
    // This means 150 = #frames(300) - #TL2_frames(150).
    EXPECT_EQ((int)GetMismatchFrames(), 150);
#endif
  }